

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::Swap(FieldDescriptorProto *this,FieldDescriptorProto *other)

{
  FieldDescriptorProto *other_local;
  FieldDescriptorProto *this_local;
  
  if (other != this) {
    std::swap<std::__cxx11::string*>(&this->name_,&other->name_);
    std::swap<int>(&this->number_,&other->number_);
    std::swap<int>(&this->label_,&other->label_);
    std::swap<int>(&this->type_,&other->type_);
    std::swap<std::__cxx11::string*>(&this->type_name_,&other->type_name_);
    std::swap<std::__cxx11::string*>(&this->extendee_,&other->extendee_);
    std::swap<std::__cxx11::string*>(&this->default_value_,&other->default_value_);
    std::swap<google::protobuf::FieldOptions*>(&this->options_,&other->options_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void FieldDescriptorProto::Swap(FieldDescriptorProto* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    std::swap(number_, other->number_);
    std::swap(label_, other->label_);
    std::swap(type_, other->type_);
    std::swap(type_name_, other->type_name_);
    std::swap(extendee_, other->extendee_);
    std::swap(default_value_, other->default_value_);
    std::swap(options_, other->options_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}